

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

size_t __thiscall OpenSSLWrapper::SslConnection::SslGetOutDataSize(SslConnection *this)

{
  size_t sVar1;
  runtime_error *this_00;
  
  if (this->m_ssl != (SSL *)0x0) {
    sVar1 = BIO_ctrl_pending((BIO *)this->m_rbio);
    return sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Not Initialized");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t SslConnection::SslGetOutDataSize()
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        return BIO_ctrl_pending(m_rbio);
    }